

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_linalg.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  PointerType *ppdVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *pBVar58;
  undefined1 auVar59 [56];
  undefined8 uVar60;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *pDVar61;
  uint uVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  ostream *poVar68;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar69;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *pCVar70;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *pCVar71;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar72;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Index index;
  char *pcVar73;
  bool bVar74;
  Index index_4;
  ulong uVar75;
  ulong uVar76;
  long lVar77;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ulong uVar78;
  long lVar79;
  undefined1 auVar82 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  Scalar SVar89;
  Scalar SVar90;
  double dVar91;
  Scalar elements [2];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double dVar123;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  double dVar143;
  undefined1 auVar144 [16];
  double dVar157;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  ChMatrixDynamic<> M2;
  ChMatrixDynamic<> Md1;
  ChMatrixDynamic<> Md2;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrixDynamic<> M1;
  ChMatrixDynamic<double> CD_t;
  ChMatrixNM<double,_4,_4> Ms;
  DstEvaluatorType dstEvaluator_1;
  ChMatrixDynamic<> M3;
  ChMatrixDynamic<> D;
  ChMatrixDynamic<double> CD;
  undefined1 local_571;
  double local_570;
  double dStack_568;
  undefined1 local_560 [16];
  double dStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  double local_4f8;
  double local_4f0;
  double local_4e8;
  undefined1 local_4e0 [24];
  variable_if_dynamic<long,__1> vStack_4c8;
  undefined1 auStack_4c0 [16];
  double dStack_4b0;
  double dStack_4a8;
  undefined1 local_4a0 [16];
  double dStack_490;
  double dStack_488;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> local_480;
  double local_460;
  double dStack_458;
  double dStack_450;
  double dStack_448;
  double local_440;
  double dStack_438;
  double dStack_430;
  double dStack_428;
  undefined8 local_410;
  uint uStack_408;
  undefined1 local_402 [2];
  undefined1 local_400 [8];
  undefined1 auStack_3f8 [8];
  undefined1 auStack_3f0 [8];
  DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *pDStack_3e8;
  undefined1 auStack_3e0 [16];
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  ulong uStack_3b8;
  undefined8 uStack_3b0;
  ulong uStack_3a8;
  undefined8 uStack_3a0;
  ulong uStack_398;
  ulong uStack_390;
  undefined8 uStack_388;
  Scalar local_348;
  double local_340;
  double local_338;
  double local_330;
  undefined8 local_328;
  undefined8 local_320;
  double local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined1 local_300 [72];
  undefined1 auStack_2b8 [8];
  double adStack_2b0 [2];
  ulong uStack_2a0;
  double dStack_298;
  ulong uStack_290;
  ulong uStack_288;
  long local_280;
  double dStack_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  ulong local_230;
  RealScalar local_228;
  RealScalar RStack_220;
  Index IStack_218;
  Index IStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *local_1c8;
  undefined1 local_1c0 [16];
  double dStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [16];
  double dStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  double dStack_f0;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  ChVector<double> local_90 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n=== Creation and assignment ===\n",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_4e0._0_16_ = ZEXT816(0);
  local_4e0._16_8_ = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)local_4e0,0x23,5,7);
  local_480.m_xpr = (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0;
  local_480.m_row = 0;
  local_480.m_col = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&local_480,0x10,4,4);
  local_300._0_64_ = vbroadcastsd_avx512f(ZEXT816(0x3fb999999999999a));
  unique0x10005ebb = local_300._0_64_;
  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_300);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
  std::ostream::put((char)poVar68);
  std::ostream::flush();
  _local_400 = local_4e0._8_16_;
  if ((long)(local_4e0._16_8_ | local_4e0._8_8_) < 0) {
LAB_001077a3:
    pcVar73 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
  }
  else {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_4e0,
               (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_400,(assign_op<double,_double> *)local_560);
    Eigen::internal::
    inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_4e0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_4e0,4,2,2);
    auVar85 = _local_400;
    _local_400 = local_4e0._8_16_;
    _pDStack_3e8 = auVar85._24_40_;
    auStack_3f0 = (undefined1  [8])0x0;
    if ((long)(local_4e0._16_8_ | local_4e0._8_8_) < 0) {
LAB_001077d7:
      pcVar73 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_001078c3;
    }
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_4e0,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_400,(assign_op<double,_double> *)local_560);
    auStack_3f8 = (undefined1  [8])local_480.m_col;
    local_400 = (undefined1  [8])local_480.m_row;
    if ((local_480.m_col | local_480.m_row) < 0) {
      pcVar73 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_001078c3;
    }
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_480,
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_400,(assign_op<double,_double> *)local_560);
    if ((local_480.m_col | local_480.m_row) < 0) goto LAB_001077d7;
    uVar75 = local_480.m_col * local_480.m_row;
    uVar78 = uVar75 + 7;
    if (-1 < (long)uVar75) {
      uVar78 = uVar75;
    }
    uVar78 = uVar78 & 0xfffffffffffffff8;
    if (7 < (long)uVar75) {
      auVar85 = vbroadcastsd_avx512f(ZEXT816(0x4008000000000000));
      lVar79 = 0;
      do {
        auVar86 = vmulpd_avx512f(auVar85,*(undefined1 (*) [64])
                                          (&((local_480.m_xpr)->
                                            super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                                            ).
                                            super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>
                                            .
                                            super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                                            .
                                            super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                                            .m_data + lVar79));
        *(undefined1 (*) [64])
         (&((local_480.m_xpr)->
           super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>.m_data
         + lVar79) = auVar86;
        lVar79 = lVar79 + 8;
      } while (lVar79 < (long)uVar78);
    }
    if ((long)uVar75 % 8 != 0 && (long)uVar78 <= (long)uVar75) {
      auVar85 = vbroadcastsd_avx512f(ZEXT816(0x4008000000000000));
      auVar86 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar87 = vpbroadcastq_avx512f();
      uVar76 = 0;
      do {
        auVar88 = vpbroadcastq_avx512f();
        auVar88 = vporq_avx512f(auVar88,auVar86);
        uVar31 = vpcmpuq_avx512f(auVar88,auVar87,2);
        ppdVar1 = &((local_480.m_xpr)->
                   super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>)
                   .super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                   .m_data + uVar78 + uVar76;
        auVar88._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * (long)ppdVar1[1];
        auVar88._0_8_ = (ulong)((byte)uVar31 & 1) * (long)*ppdVar1;
        auVar88._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * (long)ppdVar1[2];
        auVar88._24_8_ = (ulong)((byte)(uVar31 >> 3) & 1) * (long)ppdVar1[3];
        auVar88._32_8_ = (ulong)((byte)(uVar31 >> 4) & 1) * (long)ppdVar1[4];
        auVar88._40_8_ = (ulong)((byte)(uVar31 >> 5) & 1) * (long)ppdVar1[5];
        auVar88._48_8_ = (ulong)((byte)(uVar31 >> 6) & 1) * (long)ppdVar1[6];
        auVar88._56_8_ = (uVar31 >> 7) * (long)ppdVar1[7];
        auVar88 = vmulpd_avx512f(auVar88,auVar85);
        ppdVar1 = &((local_480.m_xpr)->
                   super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>)
                   .super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                   .m_data + uVar78 + uVar76;
        bVar25 = (bool)((byte)uVar31 & 1);
        bVar74 = (bool)((byte)(uVar31 >> 1) & 1);
        bVar26 = (bool)((byte)(uVar31 >> 2) & 1);
        bVar27 = (bool)((byte)(uVar31 >> 3) & 1);
        bVar28 = (bool)((byte)(uVar31 >> 4) & 1);
        bVar29 = (bool)((byte)(uVar31 >> 5) & 1);
        bVar30 = (bool)((byte)(uVar31 >> 6) & 1);
        *ppdVar1 = (PointerType)((ulong)bVar25 * auVar88._0_8_ | (ulong)!bVar25 * (long)*ppdVar1);
        ppdVar1[1] = (PointerType)
                     ((ulong)bVar74 * auVar88._8_8_ | (ulong)!bVar74 * (long)ppdVar1[1]);
        ppdVar1[2] = (PointerType)
                     ((ulong)bVar26 * auVar88._16_8_ | (ulong)!bVar26 * (long)ppdVar1[2]);
        ppdVar1[3] = (PointerType)
                     ((ulong)bVar27 * auVar88._24_8_ | (ulong)!bVar27 * (long)ppdVar1[3]);
        ppdVar1[4] = (PointerType)
                     ((ulong)bVar28 * auVar88._32_8_ | (ulong)!bVar28 * (long)ppdVar1[4]);
        ppdVar1[5] = (PointerType)
                     ((ulong)bVar29 * auVar88._40_8_ | (ulong)!bVar29 * (long)ppdVar1[5]);
        ppdVar1[6] = (PointerType)
                     ((ulong)bVar30 * auVar88._48_8_ | (ulong)!bVar30 * (long)ppdVar1[6]);
        ppdVar1[7] = (PointerType)
                     ((uVar31 >> 7) * auVar88._56_8_ |
                     (ulong)!SUB81(uVar31 >> 7,0) * (long)ppdVar1[7]);
        uVar76 = uVar76 + 8;
      } while (((long)uVar75 % 8 + 7U & 0xfffffffffffffff8) != uVar76);
    }
    if (((((local_480.m_row < 1) || (local_480.m_col < 1)) ||
         (((local_480.m_xpr)->
          super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>.m_data =
               (PointerType)0x4024000000000000, (ulong)local_480.m_row < 2)) ||
        (((ulong)local_480.m_col < 2 || ((ulong)local_480.m_col < 3)))) ||
       ((&((local_480.m_xpr)->
          super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.m_xpr)
        [local_480.m_col] =
             (XprTypeNested)
             (*(double *)
               (&((local_480.m_xpr)->
                 super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
                 super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>.
                 field_0x8 + local_480.m_col * 8) + 10.0), (ulong)local_480.m_row < 3))
    goto LAB_00107781;
    (&((local_480.m_xpr)->
      super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.m_xpr)
    [local_480.m_col * 2] = (XprTypeNested)0x4010000000000000;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_1> *)local_400,
               (DenseStorage<double,__1,__1,__1,_1> *)&local_480);
    local_560 = ZEXT816(0);
    dStack_550 = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_560,0x10,4,4);
    if (((double)local_560._8_8_ != 1.97626258336499e-323) || (dStack_550 != 1.97626258336499e-323))
    {
      pcVar73 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 4, 4, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_00107a59;
    }
    auVar85 = vsubpd_avx512f(ZEXT864(0) << 0x40,local_300._0_64_);
    *(undefined1 (*) [64])local_560._0_8_ = auVar85;
    auVar85 = vsubpd_avx512f(ZEXT864(0) << 0x40,stack0xfffffffffffffd40);
    *(undefined1 (*) [64])(local_560._0_8_ + 0x40) = auVar85;
    dStack_1b0 = 0.0;
    local_1c0 = ZEXT816(0);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_1c0,0x20,8,4);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_1c0,
               (Matrix<double,__1,__1,_1,__1,__1> *)local_400,(assign_op<double,_double> *)local_160
              );
    local_160._0_8_ = (Matrix<double,__1,__1,_1,__1,__1> *)local_400;
    Eigen::internal::
    check_for_aliasing<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_1c0,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_160);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_1c0,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_160,
               (assign_op<double,_double> *)local_100);
    if ((double *)local_1c0._0_8_ != (double *)0x0) {
      free(*(void **)(local_1c0._0_8_ + -8));
    }
    if ((double *)local_560._0_8_ != (double *)0x0) {
      free(*(void **)(local_560._0_8_ + -8));
    }
    if (local_400 != (undefined1  [8])0x0) {
      free((void *)(((non_const_type)((long)local_400 + -0x60))->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>).m_storage.m_data.
                   array[0xb]);
    }
    if (local_480.m_xpr != (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0) {
      free((void *)local_480.m_xpr[-1].
                   super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>.
                   super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                   m_outerStride);
    }
    if ((double *)local_4e0._0_8_ != (double *)0x0) {
      free(*(void **)(local_4e0._0_8_ + -8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n=== Matrix operations ===\n",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    local_480.m_xpr = (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0;
    local_480.m_row = 0;
    local_480.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&local_480,6,2,3);
    uVar62 = rand();
    iVar63 = rand();
    iVar64 = rand();
    iVar65 = rand();
    auVar81 = vpinsrd_avx(ZEXT416(uVar62),iVar63,1);
    auVar81 = vpinsrd_avx(auVar81,iVar64,2);
    auVar81 = vpinsrd_avx(auVar81,iVar65,3);
    auVar83 = vcvtdq2pd_avx(auVar81);
    auVar122._0_8_ = auVar83._0_8_ + auVar83._0_8_;
    auVar122._8_8_ = auVar83._8_8_ + auVar83._8_8_;
    auVar122._16_8_ = auVar83._16_8_ + auVar83._16_8_;
    auVar122._24_8_ = auVar83._24_8_ + auVar83._24_8_;
    auVar83._8_8_ = 0x41dfffffffc00000;
    auVar83._0_8_ = 0x41dfffffffc00000;
    auVar83._16_8_ = 0x41dfffffffc00000;
    auVar83._24_8_ = 0x41dfffffffc00000;
    auVar83 = vdivpd_avx512vl(auVar122,auVar83);
    auVar84._8_8_ = 0xbff0000000000000;
    auVar84._0_8_ = 0xbff0000000000000;
    auVar84._16_8_ = 0xbff0000000000000;
    auVar84._24_8_ = 0xbff0000000000000;
    auVar83 = vaddpd_avx512vl(auVar83,auVar84);
    _local_400 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  )auVar83;
    uVar62 = rand();
    iVar63 = rand();
    auVar85 = _local_400;
    auVar124._8_8_ = 0x41dfffffffc00000;
    auVar124._0_8_ = 0x41dfffffffc00000;
    auVar81 = vpinsrd_avx(ZEXT416(uVar62),iVar63,1);
    auVar81 = vcvtdq2pd_avx(auVar81);
    auVar82._0_8_ = auVar81._0_8_ + auVar81._0_8_;
    auVar82._8_8_ = auVar81._8_8_ + auVar81._8_8_;
    local_300._8_8_ = local_480.m_col;
    local_300._0_8_ = local_480.m_row;
    auVar81 = vdivpd_avx(auVar82,auVar124);
    auStack_3e0._0_8_ = auVar81._0_8_ + -1.0;
    _uStack_3d0 = auVar85._48_16_;
    auStack_3e0._8_8_ = auVar81._8_8_ + -1.0;
    if ((local_480.m_col | local_480.m_row) < 0) goto LAB_001077a3;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_480,
               (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)local_300,(assign_op<double,_double> *)local_4e0);
    pBVar58 = local_480.m_xpr;
    auVar83 = _local_560;
    if (((double)local_480.m_row != 9.88131291682493e-324) ||
       ((double)local_480.m_col != 1.48219693752374e-323)) {
LAB_001077f1:
      pcVar73 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, 2, 3, 1>, Rhs = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_0010799c;
    }
    local_560 = ZEXT816(0);
    uStack_548 = auVar83._24_8_;
    dStack_550 = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_560,6,2,3);
    if (((double)local_560._8_8_ != 9.88131291682493e-324) || (dStack_550 != 1.48219693752374e-323))
    {
      pcVar73 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_00107a59;
    }
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) =
           *(double *)(local_400 + lVar79 * 8) +
           (double)(&(pBVar58->
                     super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                     .m_data)[lVar79];
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    if (((double)local_480.m_row != 9.88131291682493e-324) ||
       ((double)local_480.m_col != 1.48219693752374e-323)) goto LAB_001077f1;
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) =
           *(double *)(local_400 + lVar79 * 8) +
           (double)(&((local_480.m_xpr)->
                     super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                     .m_data)[lVar79];
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    *(undefined1 (*) [8])(local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)(local_560._0_8_ + 0x18) = pDStack_3e8;
    *(undefined8 *)(local_560._0_8_ + 0x20) = auStack_3e0._0_8_;
    *(undefined8 *)(local_560._0_8_ + 0x28) = auStack_3e0._8_8_;
    *(undefined1 (*) [8])local_560._0_8_ = local_400;
    *(undefined1 (*) [8])(local_560._0_8_ + 8) = auStack_3f8;
    *(undefined1 (*) [8])(local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)(local_560._0_8_ + 0x18) = pDStack_3e8;
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) =
           (double)(&((local_480.m_xpr)->
                     super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                     .m_data)[lVar79] + *(double *)(local_560._0_8_ + lVar79 * 8);
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) =
           *(double *)(local_400 + lVar79 * 8) -
           (double)(&((local_480.m_xpr)->
                     super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                     .m_data)[lVar79];
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    *(undefined1 (*) [8])(local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)(local_560._0_8_ + 0x18) = pDStack_3e8;
    *(undefined8 *)(local_560._0_8_ + 0x20) = auStack_3e0._0_8_;
    *(undefined8 *)(local_560._0_8_ + 0x28) = auStack_3e0._8_8_;
    *(undefined1 (*) [8])local_560._0_8_ = local_400;
    *(undefined1 (*) [8])(local_560._0_8_ + 8) = auStack_3f8;
    *(undefined1 (*) [8])(local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)(local_560._0_8_ + 0x18) = pDStack_3e8;
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) =
           *(double *)(local_560._0_8_ + lVar79 * 8) -
           (double)(&((local_480.m_xpr)->
                     super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>
                     .m_data)[lVar79];
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) = *(double *)(local_400 + lVar79 * 8) * 10.0;
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    lVar79 = 0;
    do {
      *(double *)(local_560._0_8_ + lVar79 * 8) = *(double *)(local_400 + lVar79 * 8) * 10.0;
      lVar79 = lVar79 + 1;
    } while (lVar79 != 6);
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_560);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    if (((double)local_560._8_8_ != 9.88131291682493e-324) || (dStack_550 != 1.48219693752374e-323))
    {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)local_560,6,2,3);
      if (((double)local_560._8_8_ == 9.88131291682493e-324) &&
         (dStack_550 == 1.48219693752374e-323)) goto LAB_00104d24;
LAB_001077bd:
      pcVar73 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 2, 3, 1>, T1 = double, T2 = double]"
      ;
LAB_00107a59:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar73);
    }
LAB_00104d24:
    *(undefined1 (*) [8])((undefined1 *)local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)((undefined1 *)local_560._0_8_ + 0x18) =
         pDStack_3e8;
    *(undefined8 *)((undefined1 *)local_560._0_8_ + 0x20) = auStack_3e0._0_8_;
    *(undefined8 *)((undefined1 *)local_560._0_8_ + 0x28) = auStack_3e0._8_8_;
    *(undefined1 (*) [8])(undefined1 *)local_560._0_8_ = local_400;
    *(undefined1 (*) [8])((undefined1 *)local_560._0_8_ + 8) = auStack_3f8;
    *(undefined1 (*) [8])((undefined1 *)local_560._0_8_ + 0x10) = auStack_3f0;
    *(DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> **)((undefined1 *)local_560._0_8_ + 0x18) =
         pDStack_3e8;
    auVar85._8_8_ = 0x4024000000000000;
    auVar85._0_8_ = 0x4024000000000000;
    auVar85._16_8_ = 0x4024000000000000;
    auVar85._24_8_ = 0x4024000000000000;
    auVar85._32_8_ = 0x4024000000000000;
    auVar85._40_8_ = 0x4024000000000000;
    auVar85._48_8_ = 0x4024000000000000;
    auVar85._56_8_ = 0x4024000000000000;
    auVar85 = vmulpd_avx512f(ZEXT4864(SUB6448(*(undefined1 (*) [64])local_560._0_8_,0)),auVar85);
    auVar86._0_48_ = auVar85._0_48_;
    auVar86._48_8_ = *(undefined8 *)((undefined1 *)local_560._0_8_ + 0x30);
    auVar86._56_8_ = *(undefined8 *)((undefined1 *)local_560._0_8_ + 0x38);
    *(undefined1 (*) [64])local_560._0_8_ = auVar86;
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_560);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    auVar83 = _local_1c0;
    local_1c0 = ZEXT816(0);
    uStack_1a8 = auVar83._24_8_;
    dStack_1b0 = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_1c0,6,3,2);
    auVar83 = _local_160;
    local_160 = ZEXT816(0);
    uStack_148 = auVar83._24_8_;
    dStack_150 = 0.0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_160,6,2,3);
    if (dStack_1b0 != (double)local_160._8_8_) {
      pcVar73 = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
      ;
LAB_0010797d:
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar73);
    }
    local_300._8_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_160;
    local_300._0_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_1c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_100,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                *)local_300);
    if ((double)local_160._8_8_ != dStack_1b0) {
      pcVar73 = 
      "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
      ;
      goto LAB_0010797d;
    }
    local_300._8_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_1c0;
    local_300._0_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_160;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_348,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
                *)local_300);
    chrono::Q_from_AngX(1.0471975511965976);
    chrono::ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)local_300,(ChQuaternion<double> *)local_4e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rot * matrix\n",0xd);
    if (local_1c0._8_8_ != 3) {
      pcVar73 = 
      "Eigen::Product<Eigen::Matrix<double, 3, 3, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 3, 3, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
      ;
      goto LAB_0010797d;
    }
    local_4e0._8_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_1c0;
    local_4e0._0_8_ = (ChMatrix33<double> *)local_300;
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                                 *)local_4e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"matrix * rot\n",0xd);
    if (dStack_150 != 1.48219693752374e-323) {
      pcVar73 = 
      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 3, 3, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 3, 3, 1>, Option = 0]"
      ;
      goto LAB_0010797d;
    }
    local_4e0._8_8_ = (ChMatrix33<double> *)local_300;
    local_4e0._0_8_ = (DenseStorage<double,__1,__1,__1,_1> *)local_160;
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                                 *)local_4e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    if (local_348 != 0.0) {
      free(*(void **)((long)local_348 + -8));
    }
    if ((Scalar)local_100._0_8_ != 0.0) {
      free(*(void **)(local_100._0_8_ + -8));
    }
    if ((non_const_type)local_160._0_8_ != (non_const_type)0x0) {
      free((void *)(((non_const_type)(local_160._0_8_ + -0x18))->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                   m_cols);
    }
    if ((double *)local_1c0._0_8_ != (double *)0x0) {
      free(*(void **)(local_1c0._0_8_ + -8));
    }
    if ((double *)local_560._0_8_ != (double *)0x0) {
      free(*(void **)(local_560._0_8_ + -8));
    }
    if (local_480.m_xpr != (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0) {
      free((void *)local_480.m_xpr[-1].
                   super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>.
                   super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
                   m_outerStride);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n=== Chrono extensions to Eigen::MatrixBase ===\n",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    iVar63 = rand();
    local_400 = (undefined1  [8])(((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0);
    iVar63 = rand();
    auStack_3f8 = (undefined1  [8])(((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0);
    iVar63 = rand();
    auStack_3f0 = (undefined1  [8])(((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0);
    iVar63 = rand();
    pDStack_3e8 = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                  (((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0);
    iVar63 = rand();
    auStack_3e0._0_8_ = ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
    iVar63 = rand();
    auStack_3e0._8_8_ = ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"random 2x3 matrix A:\n",0x15);
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_400);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    auVar85 = _local_400;
    local_400 = (undefined1  [8])0x4024333333333333;
    auVar86 = _local_400;
    stack0xfffffffffffffc28 = auVar85._40_24_;
    _local_400 = auVar86._0_32_;
    auStack_3e0._0_8_ = 0x4024333333333333;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fill diagonal with 10.1:\n",0x19);
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_400);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    auVar85 = vbroadcastsd_avx512f(ZEXT816(0x4000cccccccccccd));
    _local_400 = auVar85._0_48_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fill entire matrix with 2.1:\n",0x1d);
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_400);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    auVar85 = _local_4e0;
    local_4e0._16_8_ = auStack_3f0;
    vStack_4c8.m_value = (long)pDStack_3e8;
    auStack_4c0._0_8_ = auStack_3e0._0_8_;
    _dStack_4b0 = auVar85._48_16_;
    auVar81 = _dStack_4b0;
    auStack_4c0._8_8_ = auStack_3e0._8_8_;
    _local_4e0 = local_400._0_32_;
    auStack_4c0._8_8_ = (double)auStack_3e0._8_8_ + 0.01;
    _local_4e0 = CONCAT1648(auVar81,_local_4e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"matrix B = A with B(1,2) incremented by 0.01\n",0x2d);
    poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_4e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|A-B| < 0.1?   ",0xf);
    auVar80._8_8_ = 0x7fffffffffffffff;
    auVar80._0_8_ = 0x7fffffffffffffff;
    auVar81 = vsubpd_avx(_auStack_3f0,stack0xfffffffffffffb30);
    auVar82 = vsubpd_avx(auStack_3e0,auStack_4c0);
    auVar124 = vsubpd_avx(_local_400,local_4e0._0_16_);
    auVar81 = vandpd_avx(auVar81,auVar80);
    auVar82 = vandpd_avx(auVar82,auVar80);
    auVar82 = vmaxpd_avx(auVar82,auVar81);
    auVar81 = vandpd_avx(auVar124,auVar80);
    auVar81 = vmaxpd_avx(auVar82,auVar81);
    auVar82 = vshufpd_avx(auVar81,auVar81,1);
    vmaxsd_avx(auVar82,auVar81);
    poVar68 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|A-B| < 0.001? ",0xf);
    auVar144._8_8_ = 0x7fffffffffffffff;
    auVar144._0_8_ = 0x7fffffffffffffff;
    auVar81 = vsubpd_avx(_auStack_3f0,stack0xfffffffffffffb30);
    auVar82 = vsubpd_avx(auStack_3e0,auStack_4c0);
    auVar124 = vsubpd_avx(_local_400,local_4e0._0_16_);
    auVar81 = vandpd_avx(auVar81,auVar144);
    auVar82 = vandpd_avx(auVar82,auVar144);
    auVar82 = vmaxpd_avx(auVar82,auVar81);
    auVar81 = vandpd_avx(auVar124,auVar144);
    auVar81 = vmaxpd_avx(auVar82,auVar81);
    auVar82 = vshufpd_avx(auVar81,auVar81,1);
    vmaxsd_avx(auVar82,auVar81);
    poVar68 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    local_480.m_xpr = (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0;
    local_480.m_row = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_480,3);
    auVar85 = local_300._0_64_;
    local_300._8_8_ = 0;
    local_300._0_8_ = &local_480;
    local_300._16_8_ = 1;
    local_300._32_32_ = auVar85._32_32_;
    local_300._24_8_ = 1;
    if (local_480.m_row < 1) {
LAB_0010780b:
      __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                    "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    ((local_480.m_xpr)->
    super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>).
    super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>,_0>.m_data =
         (PointerType)0x4000000000000000;
    local_560._0_8_ = 0x4008000000000000;
    pCVar69 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_300,
                         (Scalar *)local_560);
    local_1c0._0_8_ = 0x4010000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar69,(Scalar *)local_1c0);
    if ((local_300._24_8_ + local_300._8_8_ != *(long *)(local_300._0_8_ + 8)) ||
       ((double)local_300._16_8_ != 4.94065645841247e-324)) {
LAB_00107844:
      pcVar73 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00107abe;
    }
    local_560 = ZEXT816(0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_560,3);
    auVar85 = local_300._0_64_;
    local_300._8_8_ = 0;
    local_300._0_8_ = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_560;
    local_300._16_8_ = 1;
    local_300._32_32_ = auVar85._32_32_;
    local_300._24_8_ = 1;
    if ((long)local_560._8_8_ < 1) goto LAB_0010780b;
    *(double *)local_560._0_8_ = 0.1;
    local_1c0._0_8_ = 0x3fc999999999999a;
    pCVar69 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_300,
                         (Scalar *)local_1c0);
    local_160._0_8_ = 0x3fd3333333333333;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar69,(Scalar *)local_160);
    if ((local_300._24_8_ + local_300._8_8_ != *(long *)(local_300._0_8_ + 8)) ||
       ((double)local_300._16_8_ != 4.94065645841247e-324)) goto LAB_00107844;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"||v||_wrms, w = ",0x10);
    SVar89 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
             wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_480,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_560,(type *)0x0
                       );
    poVar68 = std::ostream::_M_insert<double>(SVar89);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"||v + v||_wrms, w = ",0x14);
    local_300._8_8_ = &local_480;
    local_300._0_8_ = &local_480;
    SVar90 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
             ::wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_300,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_560,(type *)0x0
                       );
    poVar68 = std::ostream::_M_insert<double>(SVar90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
    std::ostream::put((char)poVar68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v + v + 1: ",0xb);
    auVar85 = local_300._0_64_;
    if (-1 < local_480.m_row) {
      local_300._24_40_ = auVar85._24_40_;
      local_300._16_8_ = &local_480;
      auVar86 = local_300._0_64_;
      local_300._40_24_ = auVar85._40_24_;
      local_300._0_32_ = auVar86._0_32_;
      local_300._32_8_ = local_480.m_row;
      auVar86 = local_300._0_64_;
      local_300._56_8_ = auVar85._56_8_;
      local_300._0_48_ = auVar86._0_48_;
      local_300._48_8_ = 1.0;
      poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                   *)local_300);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
      std::ostream::put((char)poVar68);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1 + v: ",7);
      auVar85 = local_300._0_64_;
      if (-1 < local_480.m_row) {
        local_300._8_8_ = local_480.m_row;
        local_300._24_8_ = 0x3ff0000000000000;
        local_300._40_24_ = auVar85._40_24_;
        local_300._32_8_ = &local_480;
        poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_300);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
        std::ostream::put((char)poVar68);
        std::ostream::flush();
        if ((double *)local_560._0_8_ != (double *)0x0) {
          free(*(void **)(local_560._0_8_ + -8));
        }
        if (local_480.m_xpr != (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x0) {
          free((void *)local_480.m_xpr[-1].
                       super_BlockImpl<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false,_true>
                       .m_outerStride);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n=== Matrix comparison tests ===\n",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        uVar62 = rand();
        iVar63 = rand();
        uVar66 = rand();
        iVar64 = rand();
        uVar67 = rand();
        iVar65 = rand();
        auVar85 = local_300._0_64_;
        local_300._0_16_ = ZEXT816(0);
        local_300._24_40_ = auVar85._24_40_;
        local_300._16_8_ = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)local_300,6,2,3);
        if ((local_300._8_8_ != 2) || ((double)local_300._16_8_ != 1.48219693752374e-323))
        goto LAB_001077bd;
        auVar125._8_8_ = 0x41dfffffffc00000;
        auVar125._0_8_ = 0x41dfffffffc00000;
        auVar81 = vpinsrd_avx(ZEXT416(uVar62),iVar63,1);
        auVar81 = vcvtdq2pd_avx(auVar81);
        auVar92._0_8_ = auVar81._0_8_ + auVar81._0_8_;
        auVar92._8_8_ = auVar81._8_8_ + auVar81._8_8_;
        auVar81 = vdivpd_avx(auVar92,auVar125);
        dVar143 = auVar81._0_8_ + -1.0;
        dVar157 = auVar81._8_8_ + -1.0;
        auVar81 = vpinsrd_avx(ZEXT416(uVar66),iVar64,1);
        auVar81 = vcvtdq2pd_avx(auVar81);
        *(double *)local_300._0_8_ = dVar143;
        *(double *)(local_300._0_8_ + 8) = dVar157;
        auVar93._0_8_ = auVar81._0_8_ + auVar81._0_8_;
        auVar93._8_8_ = auVar81._8_8_ + auVar81._8_8_;
        auVar81 = vdivpd_avx(auVar93,auVar125);
        local_570 = auVar81._0_8_ + -1.0;
        dStack_568 = auVar81._8_8_ + -1.0;
        auVar81 = vpinsrd_avx(ZEXT416(uVar67),iVar65,1);
        auVar81 = vcvtdq2pd_avx(auVar81);
        *(double *)(local_300._0_8_ + 0x10) = local_570;
        *(double *)(local_300._0_8_ + 0x18) = dStack_568;
        auVar94._0_8_ = auVar81._0_8_ + auVar81._0_8_;
        auVar94._8_8_ = auVar81._8_8_ + auVar81._8_8_;
        auVar81 = vdivpd_avx(auVar94,auVar125);
        dVar91 = auVar81._0_8_ + -1.0;
        dVar123 = auVar81._8_8_ + -1.0;
        *(double *)(local_300._0_8_ + 0x20) = dVar91;
        *(double *)(local_300._0_8_ + 0x28) = dVar123;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Matrices are exactly equal",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        if (((long)local_300._8_8_ < 2) || ((long)local_300._16_8_ < 3)) {
LAB_00107781:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                       );
        }
        *(double *)(*(undefined1 (*) [16])(local_300._0_8_ + 0x10) + local_300._16_8_ * 8) =
             *(double *)(*(undefined1 (*) [16])(local_300._0_8_ + 0x10) + local_300._16_8_ * 8) +
             0.001;
        if ((local_300._8_8_ != 2) || ((double)local_300._16_8_ != 1.48219693752374e-323)) {
          pcVar73 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 2, 3, 1>, Rhs = const Eigen::Matrix<double, -1, -1, 1>]"
          ;
LAB_0010799c:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar73);
        }
        auVar81._8_8_ = dStack_568;
        auVar81._0_8_ = local_570;
        auVar55._8_8_ = dVar123;
        auVar55._0_8_ = dVar91;
        auVar145._8_8_ = 0x7fffffffffffffff;
        auVar145._0_8_ = 0x7fffffffffffffff;
        auVar54._8_8_ = dVar157;
        auVar54._0_8_ = dVar143;
        auVar81 = vsubpd_avx(auVar81,*(undefined1 (*) [16])(local_300._0_8_ + 0x10));
        auVar82 = vsubpd_avx(auVar55,*(undefined1 (*) [16])(local_300._0_8_ + 0x20));
        auVar124 = vsubpd_avx(auVar54,*(undefined1 (*) [16])local_300._0_8_);
        auVar81 = vandpd_avx(auVar81,auVar145);
        auVar82 = vandpd_avx(auVar82,auVar145);
        auVar82 = vmaxpd_avx(auVar82,auVar81);
        auVar81 = vandpd_avx(auVar124,auVar145);
        auVar81 = vmaxpd_avx(auVar82,auVar81);
        auVar82 = vshufpd_avx(auVar81,auVar81,1);
        auVar81 = vmaxsd_avx(auVar82,auVar81);
        if (0.002 < auVar81._0_8_) {
LAB_001059cf:
          free(*(void **)(*(undefined1 (*) [16])(local_300._0_8_ + -0x10) + 8));
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Matrices are equal within tol 0.002 \n",0x25);
          if ((undefined1 (*) [16])local_300._0_8_ != (undefined1 (*) [16])0x0) goto LAB_001059cf;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n=== Pasting matrices and matrix-blocks ===\n",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        auVar83 = _local_560;
        local_560 = ZEXT816(0);
        uStack_548 = auVar83._24_8_;
        dStack_550 = 0.0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)local_560,0x18,4,6);
        local_300._0_16_ = local_560._8_16_;
        if (-1 < (long)((ulong)dStack_550 | local_560._8_8_)) {
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_1,__1,__1> *)local_560,
                     (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)local_300,(assign_op<double,_double> *)local_400);
          poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                      (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                      local_560);
          std::__ostream_insert<char,std::char_traits<char>>(poVar68,"\n\n",2);
          auVar85 = local_300._0_64_;
          local_300._8_8_ = 0;
          local_300._0_8_ = (assign_op<double,_double> *)local_400;
          local_300._16_8_ = 1;
          local_300._32_32_ = auVar85._32_32_;
          local_300._24_8_ = 1;
          local_400 = (undefined1  [8])0x3ff0000000000000;
          local_4e0._0_8_ = 0x4000000000000000;
          pCVar70 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_300,
                               (Scalar *)local_4e0);
          local_480.m_xpr =
               (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)0x4008000000000000;
          pCVar70 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                              (pCVar70,(Scalar *)&local_480);
          local_1c0._0_8_ = 0x4010000000000000;
          pCVar70 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                              (pCVar70,(Scalar *)local_1c0);
          local_160._0_8_ = 0x4014000000000000;
          pCVar70 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                              (pCVar70,(Scalar *)local_160);
          local_100._0_8_ = 0x4018000000000000;
          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                    (pCVar70,(Scalar *)local_100);
          if ((local_300._24_8_ + local_300._8_8_ == 2) &&
             ((double)local_300._16_8_ == 1.48219693752374e-323)) {
            poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                        (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                        local_400);
            std::__ostream_insert<char,std::char_traits<char>>(poVar68,"\n\n",2);
            auVar85 = _local_4e0;
            local_4e0._0_8_ = local_300 + 0x40;
            local_4e0._16_8_ = (CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_300;
            vStack_4c8.m_value = 1;
            auStack_4c0._0_8_ = 1;
            local_480.m_row = 0;
            local_480.m_col = 1;
            local_480.m_currentBlockRows = 1;
            uStack_200 = 0;
            uStack_1f8 = 0;
            uStack_1f0 = 0;
            dStack_240 = 0.0;
            dStack_238 = 0.0;
            local_230 = 0;
            local_228 = 0.0;
            RStack_220 = 0.0;
            IStack_218 = 0;
            IStack_210 = 0;
            uStack_208 = 0;
            local_280 = 0;
            dStack_278 = 0.0;
            dStack_270 = 0.0;
            dStack_268 = 0.0;
            dStack_260 = 0.0;
            dStack_258 = 0.0;
            dStack_250 = 0.0;
            dStack_248 = 0.0;
            local_300._0_16_ = ZEXT816(0);
            local_300._0_64_ = ZEXT1664(local_300._0_16_);
            _dStack_4b0 = auVar85._48_16_;
            auStack_4c0._8_8_ = 7;
            _auStack_2b8 = ZEXT2456(ZEXT824(0));
            local_300._64_8_ = 0x4024000000000000;
            local_1c0._0_8_ = 0x4034000000000000;
            local_480.m_xpr = (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)local_4e0;
            pCVar71 = Eigen::
                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                      ::operator_(&local_480,(Scalar *)local_1c0);
            local_160._0_8_ = 0x403e000000000000;
            pCVar71 = Eigen::
                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                      ::operator_(pCVar71,(Scalar *)local_160);
            local_100._0_8_ = 0x4044000000000000;
            pCVar71 = Eigen::
                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                      ::operator_(pCVar71,(Scalar *)local_100);
            local_348 = 50.0;
            pCVar71 = Eigen::
                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                      ::operator_(pCVar71,&local_348);
            local_90[0].m_data[0] = 60.0;
            Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar71,local_90[0].m_data);
            if ((local_480.m_currentBlockRows + local_480.m_row == 2) &&
               ((double)local_480.m_col == 1.48219693752374e-323)) {
              poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                          local_300);
              std::__ostream_insert<char,std::char_traits<char>>(poVar68,"\n\n",2);
              Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
                        ((DenseStorage<double,__1,__1,__1,_1> *)local_4e0,
                         (DenseStorage<double,__1,__1,__1,_1> *)local_560);
              if ((2 < (long)local_4e0._8_8_) && (4 < (long)local_4e0._16_8_)) {
                *(undefined1 (*) [8])
                 (local_4e0._0_8_ +
                 (undefined1 *)
                 ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_4e0._16_8_
                         )->m_storage).m_data.array + 2) * 8) = local_400;
                *(undefined1 (*) [8])
                 (local_4e0._0_8_ +
                 (undefined1 *)
                 ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_4e0._16_8_
                         )->m_storage).m_data.array + 3) * 8) = auStack_3f8;
                *(undefined1 (*) [8])
                 (local_4e0._0_8_ +
                 (undefined1 *)
                 ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_4e0._16_8_
                         )->m_storage).m_data.array + 4) * 8) = auStack_3f0;
                *(double *)(local_4e0._0_8_ + (local_4e0._16_8_ * 2 + 2) * 8) = (double)pDStack_3e8;
                ((double *)(local_4e0._0_8_ + (local_4e0._16_8_ * 2 + 2) * 8))[1] =
                     (double)auStack_3e0._0_8_;
                *(undefined8 *)(local_4e0._0_8_ + (local_4e0._16_8_ * 2 + 4) * 8) =
                     auStack_3e0._8_8_;
                poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                            (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                            local_4e0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar68,"\n\n",2);
                if ((2 < (long)local_4e0._8_8_) && (4 < (long)local_4e0._16_8_)) {
                  lVar79 = 0;
                  bVar25 = true;
                  do {
                    bVar74 = bVar25;
                    lVar77 = lVar79 * local_4e0._16_8_;
                    dVar91 = *(double *)(auStack_2b8 + lVar79 * 0x38);
                    dVar123 = ((double *)
                              (local_4e0._0_8_ +
                              ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                      local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 2) * 8))
                              [1];
                    *(double *)
                     (local_4e0._0_8_ +
                     ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                             local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 2) * 8) =
                         *(double *)(auStack_2b8 + lVar79 * 0x38 + -8) +
                         *(double *)
                          (local_4e0._0_8_ +
                          ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                  local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 2) * 8);
                    ((double *)
                    (local_4e0._0_8_ +
                    ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                            local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 2) * 8))[1] =
                         dVar91 + dVar123;
                    *(double *)
                     (local_4e0._0_8_ +
                     ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                             local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 4) * 8) =
                         adStack_2b0[lVar79 * 7] +
                         *(double *)
                          (local_4e0._0_8_ +
                          ((long)(((PlainObjectBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                  local_4e0._16_8_)->m_storage).m_data.array + lVar77 + 4) * 8);
                    lVar79 = 1;
                    bVar25 = false;
                  } while (bVar74);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                               *)local_4e0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"\n\n",2);
                  if ((double *)local_4e0._0_8_ != (double *)0x0) {
                    free(*(void **)(local_4e0._0_8_ + -8));
                  }
                  if ((double *)local_560._0_8_ != (double *)0x0) {
                    free(*(void **)(local_560._0_8_ + -8));
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n=== 3x3 matrix times vector ===\n",0x21);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  auVar85 = _local_400;
                  local_4e0._0_8_ = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_300;
                  auStack_3f8 = (undefined1  [8])&local_480;
                  local_400 = (undefined1  [8])local_4e0;
                  auStack_3f0 = (undefined1  [8])local_560;
                  _auStack_3e0 = auVar85._32_32_;
                  pDStack_3e8 = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_300;
                  Eigen::internal::
                  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)local_400);
                  _auStack_3f8 = ZEXT1656(ZEXT816(0));
                  local_400 = (undefined1  [8])0x3ff0000000000000;
                  _local_400 = CONCAT832(0x3ff0000000000000,_local_400);
                  _local_400 = ZEXT4064(_local_400);
                  local_3c0 = 0x3ff0000000000000;
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                              local_400);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  auVar124 = ZEXT816(0x4008000000000000);
                  auVar180._8_8_ = 0;
                  auVar180._0_8_ = local_300._16_8_;
                  auVar178._8_8_ = 0;
                  auVar178._0_8_ = local_300._48_8_;
                  auVar172._8_8_ = 0;
                  auVar172._0_8_ = local_300._56_8_;
                  auVar167._8_8_ = 0;
                  auVar167._0_8_ = local_300._40_8_;
                  auVar174._8_8_ = 0;
                  auVar174._0_8_ = local_300._64_8_;
                  auVar158._8_8_ = 0;
                  auVar158._0_8_ =
                       (double)local_300._0_8_ + (double)local_300._8_8_ + (double)local_300._8_8_;
                  auVar81 = vfmadd231sd_fma(auVar158,auVar180,auVar124);
                  local_4f8 = auVar81._0_8_;
                  auVar176._8_8_ = 0;
                  auVar176._0_8_ =
                       (double)local_300._48_8_ +
                       (double)local_300._56_8_ + (double)local_300._56_8_;
                  auVar81 = vfmadd231sd_fma(auVar176,auVar174,auVar124);
                  local_4e8 = auVar81._0_8_;
                  auVar170._8_8_ = 0;
                  auVar170._0_8_ =
                       (double)local_300._24_8_ +
                       (double)local_300._32_8_ + (double)local_300._32_8_;
                  auVar81 = vfmadd231sd_fma(auVar170,auVar167,auVar124);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ =
                       (double)local_300._0_8_ + (double)local_300._24_8_ + (double)local_300._24_8_
                  ;
                  auVar82 = vfmadd231sd_fma(auVar95,auVar124,auVar178);
                  local_4f0 = auVar81._0_8_;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ =
                       (double)local_300._8_8_ + (double)local_300._32_8_ + (double)local_300._32_8_
                  ;
                  auVar81 = vfmadd231sd_fma(auVar96,auVar124,auVar172);
                  local_570 = auVar81._0_8_;
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ =
                       (double)local_300._16_8_ +
                       (double)local_300._40_8_ + (double)local_300._40_8_;
                  auVar81 = vfmadd231sd_fma(auVar97,auVar174,auVar124);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                              local_300);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  poVar68 = std::ostream::_M_insert<double>(local_4f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_4f0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>(local_4e8);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  poVar68 = std::ostream::_M_insert<double>(auVar82._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_570);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>(auVar81._0_8_);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n",
                             0x2b);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  _local_4e0 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                  _local_4a0 = local_4e0._0_32_;
                  local_90[0].m_data[0] = 10.0;
                  local_90[0].m_data[1] = 10.0;
                  local_90[0].m_data[2] = 10.0;
                  poVar68 = std::ostream::_M_insert<double>(10.0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_90[0].m_data[1]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>(local_90[0].m_data[2]);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  local_480.m_xpr =
                       (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)
                       ((double)local_4e0._0_8_ + (double)local_4e0._0_8_);
                  local_480.m_row = (Index)((double)local_4e0._8_8_ + (double)local_4e0._8_8_);
                  local_480.m_col = (Index)((double)local_4e0._16_8_ + (double)local_4e0._16_8_);
                  local_480.m_currentBlockRows =
                       (Index)((double)vStack_4c8.m_value + (double)vStack_4c8.m_value);
                  local_460 = (double)auStack_4c0._0_8_ + (double)auStack_4c0._0_8_;
                  dStack_458 = (double)auStack_4c0._8_8_ + (double)auStack_4c0._8_8_;
                  dStack_450 = dStack_4b0 + dStack_4b0;
                  dStack_448 = dStack_4a8 + dStack_4a8;
                  local_440 = (double)local_4a0._0_8_ + (double)local_4a0._0_8_;
                  dStack_438 = (double)local_4a0._8_8_ + (double)local_4a0._8_8_;
                  dStack_430 = dStack_490 + dStack_490;
                  dStack_428 = dStack_488 + dStack_488;
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)
                                              &local_480);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  auVar126._8_8_ = 0;
                  auVar126._0_8_ = local_90[0].m_data[0];
                  auVar146._8_8_ = 0;
                  auVar146._0_8_ = local_90[0].m_data[2];
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_480.m_xpr;
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = local_90[0].m_data[1] * local_460;
                  auVar81 = vfmadd231sd_fma(auVar98,auVar126,auVar3);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = local_480.m_row;
                  auVar159._8_8_ = 0;
                  auVar159._0_8_ = local_90[0].m_data[1] * dStack_458;
                  auVar82 = vfmadd231sd_fma(auVar159,auVar126,auVar4);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_480.m_col;
                  auVar165._8_8_ = 0;
                  auVar165._0_8_ = local_90[0].m_data[1] * dStack_450;
                  auVar124 = vfmadd231sd_fma(auVar165,auVar126,auVar5);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_480.m_currentBlockRows;
                  auVar138._8_8_ = 0;
                  auVar138._0_8_ = local_90[0].m_data[1] * dStack_448;
                  auVar80 = vfmadd231sd_fma(auVar138,auVar126,auVar6);
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_440;
                  auVar81 = vfmadd231sd_fma(auVar81,auVar146,auVar7);
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = dStack_438;
                  auVar82 = vfmadd231sd_fma(auVar82,auVar146,auVar8);
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = dStack_430;
                  auVar124 = vfmadd231sd_fma(auVar124,auVar146,auVar9);
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = dStack_428;
                  auVar80 = vfmadd231sd_fma(auVar80,auVar146,auVar10);
                  local_570 = auVar124._0_8_;
                  poVar68 = std::ostream::_M_insert<double>(auVar81._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(auVar82._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_570);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>(auVar80._0_8_);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  local_400 = (undefined1  [8])local_4e0;
                  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_400,
                                    local_90);
                  uVar2 = local_300._8_8_;
                  local_4e8 = (double)local_300._0_8_;
                  local_570 = (double)local_300._16_8_;
                  uVar60 = local_300._24_8_;
                  poVar68 = std::ostream::_M_insert<double>((double)local_300._0_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>((double)uVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_570);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>((double)uVar60);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  chrono::Q_from_AngX(0.5235987755982988);
                  chrono::ChMatrix33<double>::ChMatrix33
                            ((ChMatrix33<double> *)&local_348,(ChQuaternion<double> *)local_300);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                              &local_348);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  local_300._0_8_ = (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_348;
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                               *)local_300);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  auVar181._8_8_ = local_348;
                  auVar181._0_8_ = local_348;
                  auVar181._16_8_ = local_348;
                  auVar181._24_8_ = local_348;
                  auVar175._8_8_ = local_330;
                  auVar175._0_8_ = local_330;
                  auVar175._16_8_ = local_330;
                  auVar175._24_8_ = local_330;
                  auVar156._8_8_ = local_340;
                  auVar156._0_8_ = local_340;
                  auVar156._16_8_ = local_340;
                  auVar156._24_8_ = local_340;
                  auVar164._8_8_ = local_338;
                  auVar164._0_8_ = local_338;
                  auVar164._16_8_ = local_338;
                  auVar164._24_8_ = local_338;
                  auVar171._8_8_ = local_328;
                  auVar171._0_8_ = local_328;
                  auVar171._16_8_ = local_328;
                  auVar171._24_8_ = local_328;
                  auVar177._8_8_ = local_310;
                  auVar177._0_8_ = local_310;
                  auVar177._16_8_ = local_310;
                  auVar177._24_8_ = local_310;
                  auVar83 = vmulpd_avx512vl((undefined1  [32])_local_4e0,auVar181);
                  auVar84 = vmulpd_avx512vl((undefined1  [32])_local_4e0,auVar175);
                  auVar135._0_8_ = local_348 * (double)local_480.m_xpr;
                  auVar135._8_8_ = local_348 * (double)local_480.m_row;
                  auVar135._16_8_ = local_348 * (double)local_480.m_col;
                  auVar135._24_8_ = local_348 * (double)local_480.m_currentBlockRows;
                  auVar56._8_8_ = dStack_458;
                  auVar56._0_8_ = local_460;
                  auVar56._16_8_ = dStack_450;
                  auVar56._24_8_ = dStack_448;
                  auVar81 = vfmadd231pd_fma(auVar83,_auStack_4c0,auVar156);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),_local_4a0,auVar164);
                  _local_560 = ZEXT1632(auVar81);
                  auVar81 = vfmadd231pd_fma(auVar84,_auStack_4c0,auVar171);
                  auVar169._8_8_ = local_320;
                  auVar169._0_8_ = local_320;
                  auVar169._16_8_ = local_320;
                  auVar169._24_8_ = local_320;
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),_local_4a0,auVar169);
                  local_540 = ZEXT1632(auVar81);
                  auVar179._8_8_ = local_318;
                  auVar179._0_8_ = local_318;
                  auVar179._16_8_ = local_318;
                  auVar179._24_8_ = local_318;
                  auVar173._8_8_ = local_308;
                  auVar173._0_8_ = local_308;
                  auVar173._16_8_ = local_308;
                  auVar173._24_8_ = local_308;
                  auVar84 = vmulpd_avx512vl((undefined1  [32])_local_4e0,auVar179);
                  auVar81 = vfmadd231pd_fma(auVar84,_auStack_4c0,auVar177);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),_local_4a0,auVar173);
                  local_520 = ZEXT1632(auVar81);
                  auVar57._8_8_ = dStack_438;
                  auVar57._0_8_ = local_440;
                  auVar57._16_8_ = dStack_430;
                  auVar57._24_8_ = dStack_428;
                  auVar81 = vfmadd231pd_fma(auVar135,auVar56,auVar156);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),auVar57,auVar164);
                  _local_1c0 = ZEXT1632(auVar81);
                  auVar182._0_8_ = local_330 * (double)local_480.m_xpr;
                  auVar182._8_8_ = local_330 * (double)local_480.m_row;
                  auVar182._16_8_ = local_330 * (double)local_480.m_col;
                  auVar182._24_8_ = local_330 * (double)local_480.m_currentBlockRows;
                  auVar81 = vfmadd231pd_fma(auVar182,auVar56,auVar171);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),auVar57,auVar169);
                  local_1a0 = ZEXT1632(auVar81);
                  auVar183._0_8_ = local_318 * (double)local_480.m_xpr;
                  auVar183._8_8_ = local_318 * (double)local_480.m_row;
                  auVar183._16_8_ = local_318 * (double)local_480.m_col;
                  auVar183._24_8_ = local_318 * (double)local_480.m_currentBlockRows;
                  auVar81 = vfmadd231pd_fma(auVar183,auVar56,auVar177);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),auVar57,auVar173);
                  auVar82 = vfmadd231pd_fma(auVar135,auVar175,auVar56);
                  auVar82 = vfmadd231pd_fma(ZEXT1632(auVar82),auVar179,auVar57);
                  _local_160 = ZEXT1632(auVar82);
                  auVar136._0_8_ = (double)local_480.m_xpr * local_340;
                  auVar136._8_8_ = (double)local_480.m_row * local_340;
                  auVar136._16_8_ = (double)local_480.m_col * local_340;
                  auVar136._24_8_ = (double)local_480.m_currentBlockRows * local_340;
                  auVar82 = vfmadd231pd_fma(auVar136,auVar171,auVar56);
                  auVar82 = vfmadd231pd_fma(ZEXT1632(auVar82),auVar177,auVar57);
                  local_140 = ZEXT1632(auVar82);
                  auVar137._0_8_ = (double)local_480.m_xpr * local_338;
                  auVar137._8_8_ = (double)local_480.m_row * local_338;
                  auVar137._16_8_ = (double)local_480.m_col * local_338;
                  auVar137._24_8_ = (double)local_480.m_currentBlockRows * local_338;
                  auVar82 = vfmadd231pd_fma(auVar137,auVar169,auVar56);
                  auVar82 = vfmadd231pd_fma(ZEXT1632(auVar82),auVar173,auVar57);
                  auVar124 = vfmadd231pd_fma(auVar83,auVar175,_auStack_4c0);
                  local_120 = ZEXT1632(auVar82);
                  auVar82 = vfmadd231pd_fma(ZEXT1632(auVar124),auVar179,_local_4a0);
                  auVar83 = vmulpd_avx512vl((undefined1  [32])_local_4e0,auVar156);
                  auVar124 = vfmadd231pd_fma(auVar83,auVar171,_auStack_4c0);
                  local_180 = ZEXT1632(auVar81);
                  _local_100 = ZEXT1632(auVar82);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar124),auVar177,_local_4a0);
                  local_e0 = ZEXT1632(auVar81);
                  auVar83 = vmulpd_avx512vl((undefined1  [32])_local_4e0,auVar164);
                  auVar81 = vfmadd231pd_fma(auVar83,auVar169,_auStack_4c0);
                  auVar81 = vfmadd231pd_fma(ZEXT1632(auVar81),auVar173,_local_4a0);
                  local_c0 = ZEXT1632(auVar81);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"rot * G:\n",9);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)
                                              local_560);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"rot * (G\').transpose:\n",0x16);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)
                                              local_1c0);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"G\' * rot:\n",10);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)
                                              local_160);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"G.transpose * rot:\n",0x13);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)
                                              local_100);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  auVar59 = _auStack_3f8;
                  auStack_3f8 = (undefined1  [8])local_402;
                  local_400 = (undefined1  [8])&local_1c8;
                  auStack_3f0 = (undefined1  [8])&local_571;
                  _auStack_3e0 = auVar59._24_32_;
                  pDStack_3e8 = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_300;
                  local_1c8 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *
                              )local_300;
                  iVar63 = rand();
                  pDVar61 = local_1c8;
                  local_300._0_8_ = ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 8) = ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0
                  ;
                  pDVar61 = local_1c8;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 0x10) =
                       ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  pDVar61 = local_1c8;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 0x18) =
                       ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  pDVar61 = local_1c8;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 0x20) =
                       ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  pDVar61 = local_1c8;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 0x28) =
                       ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  pDVar61 = local_1c8;
                  iVar63 = rand();
                  *(double *)(pDVar61 + 0x30) =
                       ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                  Eigen::internal::
                  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_7,_16>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)local_400);
                  auVar127._8_8_ = 0;
                  auVar127._0_8_ = local_4e8;
                  auVar139._8_8_ = 0;
                  auVar139._0_8_ = local_570;
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar60;
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = local_300._0_8_;
                  auVar160._8_8_ = 0;
                  auVar160._0_8_ = (double)uVar2 * (double)local_300._8_8_;
                  auVar81 = vfmadd231sd_fma(auVar160,auVar127,auVar11);
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = local_300._32_8_;
                  auVar168._8_8_ = 0;
                  auVar168._0_8_ = (double)uVar2 * (double)local_300._40_8_;
                  auVar82 = vfmadd231sd_fma(auVar168,auVar127,auVar12);
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = local_300._64_8_;
                  auVar166._8_8_ = 0;
                  auVar166._0_8_ = (double)uVar2 * (double)auStack_2b8;
                  auVar124 = vfmadd231sd_fma(auVar166,auVar127,auVar13);
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = uStack_2a0;
                  auVar147._8_8_ = 0;
                  auVar147._0_8_ = (double)uVar2 * dStack_298;
                  auVar80 = vfmadd231sd_fma(auVar147,auVar127,auVar14);
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = local_300._16_8_;
                  auVar81 = vfmadd231sd_fma(auVar81,auVar139,auVar15);
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_300._48_8_;
                  auVar82 = vfmadd231sd_fma(auVar82,auVar139,auVar16);
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = adStack_2b0[0];
                  auVar124 = vfmadd231sd_fma(auVar124,auVar139,auVar17);
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = uStack_290;
                  auVar80 = vfmadd231sd_fma(auVar80,auVar139,auVar18);
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = local_300._24_8_;
                  auVar81 = vfmadd231sd_fma(auVar81,auVar99,auVar19);
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = local_300._56_8_;
                  auVar82 = vfmadd231sd_fma(auVar82,auVar99,auVar20);
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = adStack_2b0[1];
                  auVar124 = vfmadd231sd_fma(auVar124,auVar99,auVar21);
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = uStack_288;
                  auVar80 = vfmadd231sd_fma(auVar80,auVar99,auVar22);
                  local_410 = auVar81._0_8_;
                  local_4f8 = auVar82._0_8_;
                  local_4f0 = auVar124._0_8_;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Random 4x4 * q:\n",0x10);
                  poVar68 = std::ostream::_M_insert<double>(local_410);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_4f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  poVar68 = std::ostream::_M_insert<double>(local_4f0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68,"  ",2);
                  std::ostream::_M_insert<double>(auVar80._0_8_);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  auStack_3f8 = (undefined1  [8])0xc000000000000000;
                  local_400 = (undefined1  [8])0x3ff0000000000000;
                  auStack_3f0 = (undefined1  [8])0xc008000000000000;
                  pDStack_3e8 = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                0xc010000000000000;
                  auStack_3e0._0_8_ = 0x4000000000000000;
                  auStack_3e0._8_8_ = 0x3ff0000000000000;
                  uStack_3d0 = 0xc010000000000000;
                  uStack_3c8 = 0x4008000000000000;
                  local_3c0 = 0x4008000000000000;
                  uStack_3b8 = 0x4010000000000000;
                  uStack_3b0 = 0x3ff0000000000000;
                  uStack_3a8 = 0xc000000000000000;
                  uStack_3a0 = 0x4010000000000000;
                  uStack_398 = 0xc008000000000000;
                  uStack_390 = 0x4000000000000000;
                  uStack_388 = 0x3ff0000000000000;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"4x4 star matrix X:\n",0x13);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)
                                              local_400);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  uStack_3d0._4_4_ = uStack_3d0._4_4_ ^ 0x80000000;
                  uStack_3c8._4_4_ = uStack_3c8._4_4_ ^ 0x80000000;
                  auVar100._0_8_ = uStack_3b8 ^ 0x8000000000000000;
                  auVar100._8_4_ = 0;
                  auVar100._12_4_ = 0x80000000;
                  uStack_3b8 = vmovlps_avx(auVar100);
                  auVar101._0_8_ = uStack_3a8 ^ 0x8000000000000000;
                  auVar101._8_4_ = 0;
                  auVar101._12_4_ = 0x80000000;
                  uStack_3a8 = vmovlps_avx(auVar101);
                  uStack_398 = uStack_398 ^ 0x8000000000000000;
                  uStack_390 = uStack_390 ^ 0x8000000000000000;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Semi-transpose X:\n",0x12);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)
                                              local_400);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  lVar79 = 0x18;
                  do {
                    uVar53 = *(undefined4 *)((long)&uStack_408 + lVar79);
                    uVar62 = *(uint *)(&stack0xfffffffffffffbfc + lVar79);
                    *(undefined4 *)((long)&local_410 + lVar79) =
                         *(undefined4 *)((long)&local_410 + lVar79);
                    *(uint *)((long)&local_410 + lVar79 + 4) =
                         *(uint *)((long)&local_410 + lVar79 + 4) ^ 0x80000000;
                    *(undefined4 *)((long)&uStack_408 + lVar79) = uVar53;
                    *(uint *)(&stack0xfffffffffffffbfc + lVar79) = uVar62 ^ 0x80000000;
                    auVar102._0_8_ = *(ulong *)(local_400 + lVar79) ^ 0x8000000000000000;
                    auVar102._8_4_ = 0;
                    auVar102._12_4_ = 0x80000000;
                    uVar2 = vmovlps_avx(auVar102);
                    *(undefined8 *)(local_400 + lVar79) = uVar2;
                    lVar79 = lVar79 + 0x20;
                  } while (lVar79 != 0x98);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Semi-negate X:\n",0xf);
                  poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)
                                              local_400);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n=== Use of ChTransform ===\n",0x1c);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  auVar87 = local_300._0_64_;
                  auVar86 = _local_400;
                  auVar85 = _local_4e0;
                  auVar83 = _local_560;
                  local_4e0._8_8_ = 0x4008000000000000;
                  local_4e0._0_8_ = (PointerType)0x4000000000000000;
                  auStack_3f8 = (undefined1  [8])0x3fdae2a81b75e576;
                  local_400 = (undefined1  [8])0x3fc1ec70124e98f9;
                  auStack_3f0 = (undefined1  [8])0x3fe1ec70124e98f9;
                  _auStack_3e0 = auVar86._32_32_;
                  pDStack_3e8 = (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)
                                0x3fe6678c16e23f37;
                  _vStack_4c8 = auVar85._24_40_;
                  local_4e0._16_8_ = 0x4010000000000000;
                  local_480.m_xpr =
                       (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)
                       0x4014000000000000;
                  local_480.m_row = 0x4018000000000000;
                  local_480.m_col = 0x401c000000000000;
                  local_300._8_8_ = 0x4018000000000000;
                  local_300._0_8_ = 0x4014000000000000;
                  local_300._16_8_ = 0x401c000000000000;
                  local_300._24_8_ = 0x3fc1ec70124e98f9;
                  local_300._32_8_ = 0x3fdae2a81b75e576;
                  local_300._40_8_ = 0x3fe1ec70124e98f9;
                  local_560._8_8_ = 0x4021ffffffffffff;
                  local_560._0_8_ = (double *)0x401e5a5a5a5a5a5a;
                  local_300._56_8_ = auVar87._56_8_;
                  local_300._48_8_ = 0.7001400420140048;
                  uStack_548 = auVar83._24_8_;
                  dStack_550 = 10.64705882352941;
                  chrono::ChTransform<double>::TransformLocalToParent
                            ((ChVector<double> *)local_4e0,(ChVector<double> *)&local_480,
                             (ChQuaternion<double> *)local_400);
                  chrono::ChCoordsys<double>::TransformLocalToParent
                            ((ChCoordsys<double> *)local_300,(ChVector<double> *)local_4e0);
                  auVar148._8_8_ = 0;
                  auVar148._0_8_ = local_4e0._0_8_;
                  auVar161._8_8_ = 0;
                  auVar161._0_8_ = local_4e0._16_8_;
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = (double)local_4e0._8_8_ * 0.2745098039215686;
                  auVar81 = vfmadd231sd_fma(auVar103,auVar148,ZEXT816(0xbfe3737373737374));
                  auVar140._8_8_ = 0;
                  auVar140._0_8_ = (double)local_4e0._8_8_ * 0.9019607843137254;
                  auVar82 = vfmadd231sd_fma(auVar140,auVar148,ZEXT816(0x3fdb9b9b9b9b9b9a));
                  auVar81 = vfmadd231sd_fma(auVar81,auVar161,ZEXT816(0x3fe7d7d7d7d7d7d7));
                  auVar82 = vfmadd231sd_fma(auVar82,auVar161,ZEXT816(0x3f941414141413c0));
                  auVar128._8_8_ = 0;
                  auVar128._0_8_ = (double)local_4e0._8_8_ * -0.3333333333333335;
                  auVar124 = vfmadd231sd_fma(auVar128,auVar148,ZEXT816(0x3fe5555555555554));
                  auVar124 = vfmadd231sd_fma(auVar124,auVar161,ZEXT816(0x3fe5555555555554));
                  auVar32._8_8_ = 0x7fffffffffffffff;
                  auVar32._0_8_ = 0x7fffffffffffffff;
                  auVar149._8_8_ = 0;
                  auVar149._0_8_ = 7.588235294117647 - (double)local_1c0._0_8_;
                  auVar80 = vandpd_avx512vl(auVar149,auVar32);
                  if (auVar80._0_8_ < 1e-06) {
                    auVar33._8_8_ = 0x7fffffffffffffff;
                    auVar33._0_8_ = 0x7fffffffffffffff;
                    auVar150._8_8_ = 0;
                    auVar150._0_8_ = 8.999999999999998 - (double)local_1c0._8_8_;
                    auVar80 = vandpd_avx512vl(auVar150,auVar33);
                    if (auVar80._0_8_ < 1e-06) {
                      auVar34._8_8_ = 0x7fffffffffffffff;
                      auVar34._0_8_ = 0x7fffffffffffffff;
                      auVar151._8_8_ = 0;
                      auVar151._0_8_ = 10.64705882352941 - dStack_1b0;
                      vandpd_avx512vl(auVar151,auVar34);
                    }
                  }
                  local_570 = auVar124._0_8_ + (double)local_480.m_row;
                  dVar91 = auVar81._0_8_ + (double)local_480.m_xpr;
                  dVar123 = auVar82._0_8_ + (double)local_480.m_col;
                  poVar68 = std::ostream::_M_insert<bool>(true);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68," ",1);
                  auVar35._8_8_ = 0x7fffffffffffffff;
                  auVar35._0_8_ = 0x7fffffffffffffff;
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = 7.588235294117647 - (double)local_160._0_8_;
                  auVar81 = vandpd_avx512vl(auVar104,auVar35);
                  if (auVar81._0_8_ < 1e-06) {
                    auVar36._8_8_ = 0x7fffffffffffffff;
                    auVar36._0_8_ = 0x7fffffffffffffff;
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = 8.999999999999998 - (double)local_160._8_8_;
                    auVar81 = vandpd_avx512vl(auVar105,auVar36);
                    if (auVar81._0_8_ < 1e-06) {
                      auVar37._8_8_ = 0x7fffffffffffffff;
                      auVar37._0_8_ = 0x7fffffffffffffff;
                      auVar106._8_8_ = 0;
                      auVar106._0_8_ = 10.64705882352941 - dStack_150;
                      vandpd_avx512vl(auVar106,auVar37);
                    }
                  }
                  poVar68 = std::ostream::_M_insert<bool>(SUB81(poVar68,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68," ",1);
                  auVar38._8_8_ = 0x7fffffffffffffff;
                  auVar38._0_8_ = 0x7fffffffffffffff;
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = 7.588235294117647 - dVar91;
                  auVar81 = vandpd_avx512vl(auVar107,auVar38);
                  if ((auVar81._0_8_ < 1e-06) &&
                     (auVar39._8_8_ = 0x7fffffffffffffff, auVar39._0_8_ = 0x7fffffffffffffff,
                     auVar108._8_8_ = 0, auVar108._0_8_ = 8.999999999999998 - local_570,
                     auVar81 = vandpd_avx512vl(auVar108,auVar39), auVar81._0_8_ < 1e-06)) {
                    auVar40._8_8_ = 0x7fffffffffffffff;
                    auVar40._0_8_ = 0x7fffffffffffffff;
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = 10.64705882352941 - dVar123;
                    vandpd_avx512vl(auVar109,auVar40);
                  }
                  poVar68 = std::ostream::_M_insert<bool>(SUB81(poVar68,0));
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  chrono::ChTransform<double>::TransformParentToLocal
                            ((ChVector<double> *)local_560,(ChVector<double> *)&local_480,
                             (ChQuaternion<double> *)local_400);
                  local_1d8 = (double)local_560._8_8_ - (double)local_480.m_row;
                  local_410 = (double)local_560._0_8_ - (double)local_480.m_xpr;
                  local_1d0 = dStack_550 - (double)local_480.m_col;
                  local_1e8 = local_1d8 * 0.6666666666666665;
                  auVar141._8_8_ = 0;
                  auVar141._0_8_ = local_410;
                  auVar152._8_8_ = 0;
                  auVar152._0_8_ = local_1e8;
                  auVar81 = vfmadd213sd_fma(ZEXT816(0xbfe3737373737374),auVar141,auVar152);
                  local_570 = -0.607843137254902;
                  auVar129._8_8_ = 0;
                  auVar129._0_8_ = local_1d0;
                  auVar81 = vfmadd231sd_fma(auVar81,auVar129,ZEXT816(0x3fdb9b9b9b9b9b9a));
                  local_4e8 = auVar81._0_8_;
                  chrono::ChCoordsys<double>::TransformParentToLocal
                            ((ChCoordsys<double> *)local_300,(ChVector<double> *)local_560);
                  local_4f8 = (double)local_560._8_8_ - (double)local_480.m_row;
                  local_4f0 = (double)local_560._0_8_ - (double)local_480.m_xpr;
                  local_1e0 = local_4f8 * 0.6666666666666665;
                  auVar41._8_8_ = 0x7fffffffffffffff;
                  auVar41._0_8_ = 0x7fffffffffffffff;
                  auVar130._8_8_ = 0;
                  auVar130._0_8_ = (double)local_4e0._0_8_ - (double)local_100._0_8_;
                  auVar81 = vandpd_avx512vl(auVar130,auVar41);
                  if (auVar81._0_8_ < 1e-06) {
                    auVar42._8_8_ = 0x7fffffffffffffff;
                    auVar42._0_8_ = 0x7fffffffffffffff;
                    auVar131._8_8_ = 0;
                    auVar131._0_8_ = (double)local_4e0._8_8_ - (double)local_100._8_8_;
                    auVar81 = vandpd_avx512vl(auVar131,auVar42);
                    if (auVar81._0_8_ < 1e-06) {
                      auVar43._8_8_ = 0x7fffffffffffffff;
                      auVar43._0_8_ = 0x7fffffffffffffff;
                      auVar132._8_8_ = 0;
                      auVar132._0_8_ = (double)local_4e0._16_8_ - dStack_f0;
                      vandpd_avx512vl(auVar132,auVar43);
                    }
                  }
                  auVar133._8_8_ = 0;
                  auVar133._0_8_ = local_570;
                  dVar91 = dStack_550 - (double)local_480.m_col;
                  auVar153._8_8_ = 0;
                  auVar153._0_8_ = local_4f0;
                  auVar162._8_8_ = 0;
                  auVar162._0_8_ = local_1e0;
                  auVar81 = vfmadd213sd_fma(auVar133,auVar153,auVar162);
                  local_570 = auVar81._0_8_;
                  poVar68 = std::ostream::_M_insert<bool>(true);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68," ",1);
                  auVar44._8_8_ = 0x7fffffffffffffff;
                  auVar44._0_8_ = 0x7fffffffffffffff;
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = (double)local_4e0._0_8_ - local_4e8;
                  auVar81 = vandpd_avx512vl(auVar110,auVar44);
                  if (auVar81._0_8_ < 1e-06) {
                    auVar154._8_8_ = 0;
                    auVar154._0_8_ = local_410;
                    auVar163._8_8_ = 0;
                    auVar163._0_8_ = local_1d0;
                    auVar111._8_8_ = 0;
                    auVar111._0_8_ = local_1d8 * -0.3333333333333335;
                    auVar81 = vfmadd231sd_fma(auVar111,auVar154,ZEXT816(0x3fd1919191919191));
                    auVar81 = vfmadd231sd_fma(auVar81,auVar163,ZEXT816(0x3fecdcdcdcdcdcdc));
                    auVar45._8_8_ = 0x7fffffffffffffff;
                    auVar45._0_8_ = 0x7fffffffffffffff;
                    auVar112._8_8_ = 0;
                    auVar112._0_8_ = (double)local_4e0._8_8_ - auVar81._0_8_;
                    auVar81 = vandpd_avx512vl(auVar112,auVar45);
                    if (auVar81._0_8_ < 1e-06) {
                      auVar113._8_8_ = 0;
                      auVar113._0_8_ = local_1e8;
                      auVar81 = vfmadd132sd_fma(auVar154,auVar113,ZEXT816(0x3fe7d7d7d7d7d7d7));
                      auVar81 = vfmadd132sd_fma(auVar163,auVar81,ZEXT816(0x3f941414141413c0));
                      auVar46._8_8_ = 0x7fffffffffffffff;
                      auVar46._0_8_ = 0x7fffffffffffffff;
                      auVar114._8_8_ = 0;
                      auVar114._0_8_ = (double)local_4e0._16_8_ - auVar81._0_8_;
                      vandpd_avx512vl(auVar114,auVar46);
                    }
                  }
                  auVar134._8_8_ = 0;
                  auVar134._0_8_ = dVar91;
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = local_570;
                  auVar81 = vfmadd213sd_fma(ZEXT816(0x3fdb9b9b9b9b9b9a),auVar134,auVar23);
                  poVar68 = std::ostream::_M_insert<bool>(SUB81(poVar68,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68," ",1);
                  auVar47._8_8_ = 0x7fffffffffffffff;
                  auVar47._0_8_ = 0x7fffffffffffffff;
                  auVar115._8_8_ = 0;
                  auVar115._0_8_ = (double)local_4e0._0_8_ - local_348;
                  auVar82 = vandpd_avx512vl(auVar115,auVar47);
                  if (auVar82._0_8_ < 1e-06) {
                    auVar48._8_8_ = 0x7fffffffffffffff;
                    auVar48._0_8_ = 0x7fffffffffffffff;
                    auVar116._8_8_ = 0;
                    auVar116._0_8_ = (double)local_4e0._8_8_ - local_340;
                    auVar82 = vandpd_avx512vl(auVar116,auVar48);
                    if (auVar82._0_8_ < 1e-06) {
                      auVar49._8_8_ = 0x7fffffffffffffff;
                      auVar49._0_8_ = 0x7fffffffffffffff;
                      auVar117._8_8_ = 0;
                      auVar117._0_8_ = (double)local_4e0._16_8_ - local_338;
                      vandpd_avx512vl(auVar117,auVar49);
                    }
                  }
                  poVar68 = std::ostream::_M_insert<bool>(SUB81(poVar68,0));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar68," ",1);
                  auVar50._8_8_ = 0x7fffffffffffffff;
                  auVar50._0_8_ = 0x7fffffffffffffff;
                  auVar118._8_8_ = 0;
                  auVar118._0_8_ = (double)local_4e0._0_8_ - auVar81._0_8_;
                  auVar81 = vandpd_avx512vl(auVar118,auVar50);
                  if (auVar81._0_8_ < 1e-06) {
                    auVar142._8_8_ = 0;
                    auVar142._0_8_ = local_4f0;
                    auVar155._8_8_ = 0;
                    auVar155._0_8_ = dVar91;
                    auVar119._8_8_ = 0;
                    auVar119._0_8_ = local_4f8 * -0.3333333333333335;
                    auVar81 = vfmadd213sd_fma(ZEXT816(0x3fd1919191919191),auVar142,auVar119);
                    auVar81 = vfmadd213sd_fma(ZEXT816(0x3fecdcdcdcdcdcdc),auVar155,auVar81);
                    auVar51._8_8_ = 0x7fffffffffffffff;
                    auVar51._0_8_ = 0x7fffffffffffffff;
                    auVar120._8_8_ = 0;
                    auVar120._0_8_ = (double)local_4e0._8_8_ - auVar81._0_8_;
                    auVar81 = vandpd_avx512vl(auVar120,auVar51);
                    if (auVar81._0_8_ < 1e-06) {
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ = local_1e0;
                      auVar81 = vfmadd213sd_fma(ZEXT816(0x3fe7d7d7d7d7d7d7),auVar142,auVar24);
                      auVar81 = vfmadd213sd_fma(ZEXT816(0x3f941414141413c0),auVar155,auVar81);
                      auVar52._8_8_ = 0x7fffffffffffffff;
                      auVar52._0_8_ = 0x7fffffffffffffff;
                      auVar121._8_8_ = 0;
                      auVar121._0_8_ = (double)local_4e0._16_8_ - auVar81._0_8_;
                      vandpd_avx512vl(auVar121,auVar52);
                    }
                  }
                  poVar68 = std::ostream::_M_insert<bool>(SUB81(poVar68,0));
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) + (char)poVar68);
                  std::ostream::put((char)poVar68);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"\n=== Linear systems ===\n",0x18);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                  std::ostream::put(-0x78);
                  std::ostream::flush();
                  auVar85 = local_300._0_64_;
                  local_300._8_8_ = 0;
                  local_300._0_8_ = (ChQuaternion<double> *)local_400;
                  local_300._16_8_ = 1;
                  local_300._32_32_ = auVar85._32_32_;
                  local_300._24_8_ = 1;
                  local_400 = (undefined1  [8])0x3ff0000000000000;
                  local_480.m_xpr =
                       (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)
                       0x4000000000000000;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_((CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                      local_300,(Scalar *)&local_480);
                  local_560._0_8_ = 0x4008000000000000;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,(Scalar *)local_560);
                  local_1c0._0_8_ = 0x4010000000000000;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,(Scalar *)local_1c0);
                  local_160._0_8_ = 0x4014000000000000;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,(Scalar *)local_160);
                  local_100._0_8_ = 0x4018000000000000;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,(Scalar *)local_100);
                  local_348 = 7.0;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,&local_348);
                  local_90[0].m_data[0] = 8.0;
                  pCVar72 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                            operator_(pCVar72,local_90[0].m_data);
                  local_1c8 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *
                              )0x4024000000000000;
                  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                            (pCVar72,(Scalar *)&local_1c8);
                  auVar85 = local_300._0_64_;
                  if ((local_300._24_8_ + local_300._8_8_ == 3) &&
                     ((double)local_300._16_8_ == 1.48219693752374e-323)) {
                    local_4e0._0_8_ = 0x4008000000000000;
                    local_300._8_8_ = 0;
                    local_300._0_8_ = (ChVector<double> *)local_4e0;
                    local_300._16_8_ = 1;
                    local_300._32_32_ = auVar85._32_32_;
                    local_300._24_8_ = 1;
                    local_480.m_xpr =
                         (Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false> *)
                         0x4008000000000000;
                    this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                                     ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                      local_300,(Scalar *)&local_480);
                    local_560._0_8_ = 0x4010000000000000;
                    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (this,(Scalar *)local_560);
                    if ((local_300._24_8_ + local_300._8_8_ == 3) &&
                       ((double)local_300._16_8_ == 4.94065645841247e-324)) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"matrix A:\n",10);
                      poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                                  (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                   *)local_400);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) +
                                      (char)poVar68);
                      std::ostream::put((char)poVar68);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"vector b:\n",10);
                      poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                                  (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                   *)local_4e0);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) +
                                      (char)poVar68);
                      std::ostream::put((char)poVar68);
                      std::ostream::flush();
                      local_230 = local_230 & 0xffffffffffff0000;
                      local_300._0_64_ = _local_400;
                      local_300._64_8_ = local_3c0;
                      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                      computeInPlace((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                     local_300);
                      if (local_230._0_1_ == false) {
                        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                                      "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 3, 1>>]"
                                     );
                      }
                      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>::
                      _solve_impl<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                                ((ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>> *)local_300,
                                 (Matrix<double,_3,_1,_0,_3,_1> *)local_4e0,
                                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_480);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"solution:\n",10);
                      poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                                  (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                   *)&local_480);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) +
                                      (char)poVar68);
                      std::ostream::put((char)poVar68);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Ax-b:\n",6);
                      auVar85 = local_300._0_64_;
                      local_300._8_8_ = &local_480;
                      local_300._0_8_ =
                           (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_400;
                      local_300._24_40_ = auVar85._24_40_;
                      local_300._16_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)local_4e0;
                      poVar68 = Eigen::operator<<((ostream *)&std::cout,
                                                  (
                                                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  *)local_300);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar68 + -0x18) +
                                      (char)poVar68);
                      std::ostream::put((char)poVar68);
                      std::ostream::flush();
                      return 0;
                    }
                    pcVar73 = 
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                    ;
                  }
                  else {
                    pcVar73 = 
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3, 1>]"
                    ;
                  }
                  goto LAB_00107abe;
                }
              }
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 2, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 2, BlockCols = 3, InnerPanel = false]"
                           );
            }
            pcVar73 = 
            "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 5, 7, 1>, 2, 3>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 5, 7, 1>, 2, 3>]"
            ;
          }
          else {
            pcVar73 = 
            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 3, 1>]"
            ;
          }
LAB_00107abe:
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar73);
        }
        goto LAB_001077a3;
      }
    }
    pcVar73 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
LAB_001078c3:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar73);
}

Assistant:

int main(int argc, char* argv[]) {
    ///! [Basic operations with matrices]
    std::cout << "\n=== Creation and assignment ===\n" << std::endl;
    {
        // Matrix allocated on the heap.
        chrono::ChMatrixDynamic<> Md1(5, 7);
        chrono::ChMatrixDynamic<> Md2(4, 4);

        // Matrix allocated on the stack.
        chrono::ChMatrixNM<double, 4, 4> Ms;

        // 3x3 matrices, mostly used for coordinate transformations.
        chrono::ChMatrix33<> ma;

        Ms.setConstant(0.1);  // Fill a matrix with an element
        std::cout << Ms << std::endl;

        Md1.setRandom();         // initialize with random numbers
        Md1.transposeInPlace();  // transpose the matrix in place
        Md1.resize(2, 2);        // resize
        Md1.setZero();           // set all elements to zero

        Md2.setIdentity();  // Create a diagonal matrix
        Md2 *= 3;

        Md2(0, 0) = 10;  // Use the () operator to reference single elements
        Md2(1, 2) = Md2(0, 0) + Md2(1, 1);
        Md2(2, 2) = 4;

        chrono::ChMatrixDynamic<> M1(Md2);   // Copy constructor
        chrono::ChMatrixDynamic<> M2(-Ms);   // The - unary operator returns a negated matrix
        chrono::ChMatrixDynamic<> M3(8, 4);  // 8x4 uninitialized matrix
        M3 = M1;                             // Copy (resize as needed)
        M3 = M1.transpose();                 // transposed copy.
    }

    std::cout << "\n=== Matrix operations ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        chrono::ChMatrixDynamic<double> B(2, 3);
        A.setRandom();
        B.setRandom();
        chrono::ChMatrixDynamic<> result(A + B);
        result = A + B;
        result = A;
        result += B;

        // Different ways to do subtraction..
        result = A - B;
        result = A;
        result -= B;

        // Multiplication with scalar
        result = A * 10;
        result = 10 * A;
        std::cout << result << std::endl;

        result = A;
        result *= 10;
        std::cout << result << std::endl;

        // Matrix multiplications
        chrono::ChMatrixDynamic<> C(3, 2);
        chrono::ChMatrixDynamic<> D(2, 3);
        chrono::ChMatrixDynamic<double> CD = C * D;
        chrono::ChMatrixDynamic<double> CD_t = D.transpose() * C.transpose();

        chrono::ChMatrix33<> R(chrono::Q_from_AngX(chrono::CH_C_PI / 3));
        std::cout << "rot * matrix\n" << R * C << std::endl;
        std::cout << "matrix * rot\n" << D * R << std::endl;
    }

    std::cout << "\n=== Chrono extensions to Eigen::MatrixBase ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        std::cout << "random 2x3 matrix A:\n" << A << std::endl;
        A.fillDiagonal(10.1);
        std::cout << "fill diagonal with 10.1:\n" << A << std::endl;
        A.fill(2.1);
        std::cout << "fill entire matrix with 2.1:\n" << A << std::endl;

        chrono::ChMatrixNM<double, 2, 3> B(A);
        B(1, 2) += 0.01;
        std::cout << "matrix B = A with B(1,2) incremented by 0.01\n" << B << std::endl;
        std::cout << "|A-B| < 0.1?   " << A.equals(B, 0.1) << std::endl;
        std::cout << "|A-B| < 0.001? " << A.equals(B, 0.001) << std::endl;

        chrono::ChVectorDynamic<> v(3);
        v << 2, 3, 4;
        chrono::ChVectorDynamic<> w(3);
        w << 0.1, 0.2, 0.3;
        std::cout << "||v||_wrms, w = " << v.wrmsNorm(w) << std::endl;
        std::cout << "||v + v||_wrms, w = " << (v + v).wrmsNorm(w) << std::endl;

        std::cout << "v + v + 1: " << (v + v) + 1 << std::endl;
        std::cout << "1 + v: " << 1 + v << std::endl;
    }

    std::cout << "\n=== Matrix comparison tests ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        chrono::ChMatrixDynamic<> B(A);
        if (A == B) {
            std::cout << "Matrices are exactly equal" << std::endl;
        }

        // Tolerance comparison
        B(1, 2) += 0.001;
        if (A.equals(B, 0.002)) {
            std::cout << "Matrices are equal within tol 0.002 \n";
        }
    }

    std::cout << "\n=== Pasting matrices and matrix-blocks ===\n" << std::endl;
    {
        chrono::ChMatrixDynamic<> A(4, 6);
        A.setRandom();
        std::cout << A << "\n\n";

        chrono::ChMatrixNM<double, 2, 3> B;
        B << 1, 2, 3, 4, 5, 6;
        std::cout << B << "\n\n";

        chrono::ChMatrixNM<double, 5, 7> C;
        C.setZero();
        C.block<2, 3>(1, 1) << 10, 20, 30, 40, 50, 60;
        std::cout << C << "\n\n";

        chrono::ChMatrixDynamic<> X = A;
        X.block<2, 3>(1, 2) = B;
        std::cout << X << "\n\n";

        X.block<2, 3>(1, 2) += C.block<2, 3>(1, 1);
        std::cout << X << "\n\n";
    }

    std::cout << "\n=== 3x3 matrix times vector ===\n" << std::endl;
    {
        chrono::ChVector<> v(1, 2, 3);
        chrono::ChMatrix33<> A;
        A.setRandom();

        chrono::ChMatrix33<> B(1);
        std::cout << B << std::endl;

        // Vector transformation, typical product [A] * v
        chrono::ChVector<> res1 = A * v;

        // Inverse vector transformation, [A]' * v
        chrono::ChVector<> res2 = A.transpose() * v;

        std::cout << A << std::endl;
        std::cout << res1 << std::endl;
        std::cout << res2 << std::endl;
    }

    std::cout << "\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n" << std::endl;
    {
        chrono::ChMatrix34<> G = Eigen::Matrix<double, 3, 4>::Ones(3, 4);
        chrono::ChQuaternion<> q(1, 2, 3, 4);
        chrono::ChVector<> v = G * q;
        std::cout << v << std::endl;

        chrono::ChMatrix43<> Gt = 2 * G.transpose();
        std::cout << Gt << std::endl;
        q = Gt * v;
        std::cout << q << std::endl;
        q = G.transpose() * v;
        std::cout << q << std::endl;

        chrono::ChMatrix33<> rot(chrono::Q_from_AngX(chrono::CH_C_PI / 6));
        std::cout << rot << std::endl;
        std::cout << rot.transpose() << std::endl;

        chrono::ChMatrix34<> res1 = rot * G;
        chrono::ChMatrix34<> res2 = rot * Gt.transpose();
        chrono::ChMatrix43<> res3 = Gt * rot;
        chrono::ChMatrix43<> res4 = G.transpose() * rot;
        std::cout << "rot * G:\n" << res1 << std::endl;
        std::cout << "rot * (G').transpose:\n" << res2 << std::endl;
        std::cout << "G' * rot:\n" << res3 << std::endl;
        std::cout << "G.transpose * rot:\n" << res4 << std::endl;

        chrono::ChMatrix44<> A44;
        A44.setRandom();
        chrono::ChQuaternion<> q2 = A44 * q;
        std::cout << "Random 4x4 * q:\n" << q2 << std::endl; 

        chrono::ChStarMatrix44<> X(chrono::ChQuaternion<>(1, 2, 3, 4));
        std::cout << "4x4 star matrix X:\n" << X << std::endl;
        X.semiTranspose();
        std::cout << "Semi-transpose X:\n" << X << std::endl;
        X.semiNegate();
        std::cout << "Semi-negate X:\n" << X << std::endl;
    }

    std::cout << "\n=== Use of ChTransform ===\n" << std::endl;
    {
        chrono::ChVector<> vl(2, 3, 4);        // local point to transform
        chrono::ChVector<> t(5, 6, 7);         // translation of coord system
        chrono::ChQuaternion<> q(1, 3, 4, 5);  // rotation of coord system (quaternion)
        q.Normalize();                         // as unit quaternion, must be normalized
        chrono::ChMatrix33<> R;                // rotation of coord system (rotation matrix)
        R.Set_A_quaternion(q);                 // set from quaternion
        chrono::Coordsys csys(t, q);           // coordinate system representing translation + rotation

        // Perform the transformation: v = t + [R] * v'
        // NOTE: all the following ways will give the same result, so you can use them equivalently!
        auto va1 = chrono::ChTransform<>::TransformLocalToParent(vl, t, R);
        auto va2 = chrono::ChTransform<>::TransformLocalToParent(vl, t, q);
        auto va3 = csys.TransformLocalToParent(vl);
        auto va4 = t + R * vl;
        std::cout << va2.Equals(va1, 1e-6) << " " << va3.Equals(va1, 1e-6) << " " << va4.Equals(va1, 1e-6) << std::endl;

        // Inverse transformation
        auto vl1 = chrono::ChTransform<>::TransformParentToLocal(va1, t, q);
        auto vl2 = chrono::ChTransform<>::TransformParentToLocal(va1, t, R);
        auto vl3 = csys.TransformParentToLocal(va1);
        auto vl4 = R.transpose() * (va1 - t);
        std::cout << vl1.Equals(vl, 1e-6) << " " << vl2.Equals(vl, 1e-6) << " " << vl3.Equals(vl, 1e-6) << " "
                  << vl4.Equals(vl, 1e-6) << std::endl;
    }

    std::cout << "\n=== Linear systems ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 3, 3> A;
        Eigen::Vector3d b;
        A << 1, 2, 3, 4, 5, 6, 7, 8, 10;
        b << 3, 3, 4;
        std::cout << "matrix A:\n" << A << std::endl;
        std::cout << "vector b:\n" << b << std::endl;
        Eigen::Vector3d x = A.colPivHouseholderQr().solve(b);
        std::cout << "solution:\n" << x << std::endl;
        std::cout << "Ax-b:\n" << A * x - b << std::endl;
    }
    ///! [Basic operations with matrices]

    return 0;
}